

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O0

int __thiscall dlib::file::init(file *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  file_not_found *this_00;
  time_point tVar5;
  stat64 buffer;
  size_type pos;
  char buf [4096];
  string *in_stack_ffffffffffffee78;
  file_not_found *in_stack_ffffffffffffee80;
  time_t in_stack_ffffffffffffee88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeec0;
  char *in_stack_ffffffffffffeec8;
  stat64 local_1128;
  string local_1098 [39];
  undefined1 local_1071;
  long local_1050;
  undefined1 local_1045;
  char local_1018 [4104];
  EVP_PKEY_CTX *local_10;
  file *local_8;
  
  local_10 = ctx;
  local_8 = this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pcVar3 = realpath(pcVar3,local_1018);
  if (pcVar3 == (char *)0x0) {
    local_1045 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::operator+(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
    file_not_found::file_not_found(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78);
    local_1045 = 0;
    __cxa_throw(uVar4,&file_not_found::typeinfo,file_not_found::~file_not_found);
  }
  std::__cxx11::string::operator=((string *)&(this->state).full_name,local_1018);
  cVar1 = directory::get_separator();
  local_1050 = std::__cxx11::string::find_last_of((char)this + '(',(ulong)(uint)(int)cVar1);
  if (local_1050 == -1) {
    local_1071 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::operator+(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
    file_not_found::file_not_found(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78);
    local_1071 = 0;
    __cxa_throw(uVar4,&file_not_found::typeinfo,file_not_found::~file_not_found);
  }
  std::__cxx11::string::substr((ulong)local_1098,(ulong)&(this->state).full_name);
  std::__cxx11::string::operator=((string *)&(this->state).name,local_1098);
  std::__cxx11::string::~string(local_1098);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = stat64(pcVar3,&local_1128);
  if ((iVar2 == 0) && ((local_1128.st_mode & 0xf000) != 0x4000)) {
    (this->state).file_size = local_1128.st_size;
    tVar5 = std::chrono::_V2::system_clock::from_time_t(in_stack_ffffffffffffee88);
    (this->state).last_modified.__d.__r = (rep)tVar5.__d.__r;
    return (int)this;
  }
  this_00 = (file_not_found *)__cxa_allocate_exception(0x30);
  std::operator+(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  file_not_found::file_not_found(this_00,in_stack_ffffffffffffee78);
  __cxa_throw(this_00,&file_not_found::typeinfo,file_not_found::~file_not_found);
}

Assistant:

void file::
    init (
        const std::string& name
    )
    {
        using namespace std;



        char buf[PATH_MAX];
        if (realpath(name.c_str(),buf) == 0)
        {
            // the file was not found
            throw file_not_found("Unable to find file " + name);
        }
        state.full_name = buf;


        string::size_type pos = state.full_name.find_last_of(directory::get_separator());
        if (pos == string::npos)
        {
            // no valid full path has no separtor characters.  
            throw file_not_found("Unable to find file " + name);
        }
        state.name = state.full_name.substr(pos+1);


        // now find the size of this file
        struct stat64 buffer;
        if (::stat64(state.full_name.c_str(), &buffer) ||
            S_ISDIR(buffer.st_mode))
        {
            // there was an error during the call to stat64 or
            // name is actually a directory
            throw file_not_found("Unable to find file " + name);
        }
        else
        {
            state.file_size = static_cast<uint64>(buffer.st_size);


            state.last_modified = std::chrono::system_clock::from_time_t(buffer.st_mtime);
#ifdef _BSD_SOURCE 
            state.last_modified += std::chrono::nanoseconds(buffer.st_atim.tv_nsec);
#endif
        }

    }